

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_enum_ostream_operator_decl
          (t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"std::ostream& operator<<(std::ostream& out, const ",0x32);
  bVar1 = this->gen_pure_enums_;
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"::type&",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," val);",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_ostream_operator_decl(std::ostream& out, t_enum* tenum) {

  out << "std::ostream& operator<<(std::ostream& out, const ";
  if (gen_pure_enums_) {
    out << tenum->get_name();
  } else {
    out << tenum->get_name() << "::type&";
  }
  out << " val);" << endl;
  out << endl;
}